

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::RemoveBuiltinCommand(cmState *this,string *name)

{
  __type _Var1;
  bool bVar2;
  pointer ppVar3;
  _Self local_48;
  _Self local_40;
  iterator i;
  string *name_local;
  cmState *this_local;
  
  cmsys::SystemTools::LowerCase((string *)&i,name);
  _Var1 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i);
  if (!_Var1) {
    __assert_fail("name == cmSystemTools::LowerCase(name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmState.cxx"
                  ,0x1fa,"void cmState::RemoveBuiltinCommand(const std::string &)");
  }
  std::__cxx11::string::~string((string *)&i);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
       ::find(&this->BuiltinCommands,name);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
       ::end(&this->BuiltinCommands);
  bVar2 = std::operator!=(&local_40,&local_48);
  if (!bVar2) {
    __assert_fail("i != this->BuiltinCommands.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmState.cxx"
                  ,0x1fd,"void cmState::RemoveBuiltinCommand(const std::string &)");
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>
           ::operator->(&local_40);
  if (ppVar3->second != (cmCommand *)0x0) {
    (*ppVar3->second->_vptr_cmCommand[1])();
  }
  std::
  map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
  ::erase_abi_cxx11_((map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                      *)&this->BuiltinCommands,(iterator)local_40._M_node);
  return;
}

Assistant:

void cmState::RemoveBuiltinCommand(std::string const& name)
{
  assert(name == cmSystemTools::LowerCase(name));
  std::map<std::string, cmCommand*>::iterator i =
    this->BuiltinCommands.find(name);
  assert(i != this->BuiltinCommands.end());
  delete i->second;
  this->BuiltinCommands.erase(i);
}